

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

void __thiscall Fl_Preferences::Node::deleteAllEntries(Node *this)

{
  int local_14;
  int i;
  Node *this_local;
  
  if (this->entry_ != (Entry *)0x0) {
    for (local_14 = 0; local_14 < this->nEntry_; local_14 = local_14 + 1) {
      if (this->entry_[local_14].name != (char *)0x0) {
        free(this->entry_[local_14].name);
        this->entry_[local_14].name = (char *)0x0;
      }
      if (this->entry_[local_14].value != (char *)0x0) {
        free(this->entry_[local_14].value);
        this->entry_[local_14].value = (char *)0x0;
      }
    }
    free(this->entry_);
    this->entry_ = (Entry *)0x0;
    this->nEntry_ = 0;
    this->NEntry_ = 0;
  }
  this->field_0x30 = this->field_0x30 & 0xfe | 1;
  return;
}

Assistant:

void Fl_Preferences::Node::deleteAllEntries() {
  if ( entry_ ) {
    for ( int i = 0; i < nEntry_; i++ ) {
      if ( entry_[i].name ) {
	free( entry_[i].name );
	entry_[i].name = 0L;
      }
      if ( entry_[i].value ) {
	free( entry_[i].value );
	entry_[i].value = 0L;
      }
    }
    free( entry_ );
    entry_ = 0L;
    nEntry_ = 0;
    NEntry_ = 0;
  }
  dirty_ = 1;
}